

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_rule.hpp
# Opt level: O2

error_code __thiscall
pstore::exchange::import_ns::rule::push<pstore::exchange::import_ns::uint64_rule,unsigned_long*>
          (rule *this,unsigned_long *args)

{
  context *pcVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  _Head_base<0UL,_pstore::exchange::import_ns::uint64_rule_*,_false> local_30;
  _Head_base<0UL,_pstore::exchange::import_ns::uint64_rule_*,_false> local_28;
  unsigned_long *args_local;
  
  pcVar1 = (this->context_).ptr_;
  args_local = args;
  std::
  make_unique<pstore::exchange::import_ns::uint64_rule,pstore::gsl::not_null<pstore::exchange::import_ns::context*>const&,unsigned_long*&>
            ((not_null<pstore::exchange::import_ns::context_*> *)&local_28,
             (unsigned_long **)&this->context_);
  local_30._M_head_impl = local_28._M_head_impl;
  local_28._M_head_impl = (uint64_rule *)0x0;
  std::
  deque<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>,std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>>>
  ::
  emplace_back<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>>
            ((deque<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>,std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>>>
              *)&pcVar1->stack,
             (unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
              *)&local_30);
  if (local_30._M_head_impl != (uint64_rule *)0x0) {
    (*((local_30._M_head_impl)->super_rule)._vptr_rule[1])();
  }
  local_30._M_head_impl = (uint64_rule *)0x0;
  std::
  unique_ptr<pstore::exchange::import_ns::uint64_rule,_std::default_delete<pstore::exchange::import_ns::uint64_rule>_>
  ::~unique_ptr((unique_ptr<pstore::exchange::import_ns::uint64_rule,_std::default_delete<pstore::exchange::import_ns::uint64_rule>_>
                 *)&local_28);
  log_top(this,true);
  uVar3 = std::_V2::system_category();
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar3;
  return (error_code)(auVar2 << 0x40);
}

Assistant:

std::error_code push (Args... args) {
                    context_->stack.push (std::make_unique<T> (context_, args...));
                    this->log_top (true);
                    return {};
                }